

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

char * rtosc_bundle_fetch(char *buffer,uint elm)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint8_t *arg_pos;
  ulong uVar3;
  
  arg_pos = (uint8_t *)(buffer + 0x10);
  uVar3 = (ulong)elm;
  while (uVar3 != 0) {
    uVar1 = extract_uint32(arg_pos);
    if (uVar1 == 0) break;
    arg_pos = arg_pos + (ulong)(uVar1 & 0xfffffffc) + 4;
    uVar3 = uVar3 - 1;
  }
  puVar2 = (uint8_t *)0x0;
  if (uVar3 == 0) {
    puVar2 = arg_pos + 4;
  }
  return (char *)puVar2;
}

Assistant:

const char *rtosc_bundle_fetch(const char *buffer, unsigned elm)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elm_pos = 0;
    while(elm_pos!=elm && extract_uint32((const uint8_t*)lengths)) {
        ++elm_pos;
        lengths += extract_uint32((const uint8_t*)lengths)/4+1;
    }

    return (const char*) (elm==elm_pos?lengths+1:NULL);
}